

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_multiclasstask.cc
# Opt level: O2

void MulticlassTask::run(search *sch,multi_ex *ec)

{
  ulong *puVar1;
  action aVar2;
  stringstream *psVar3;
  ostream *poVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  size_t learner_id;
  long lVar8;
  size_t i;
  ulong uVar9;
  float loss;
  action oracle;
  ulong local_48;
  ulong local_40;
  multi_ex *local_38;
  
  puVar1 = (ulong *)sch->task_data;
  local_48 = (ulong)((*(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                       super__Vector_impl_data._M_start)->l).multi.label;
  local_40 = local_48 - 1;
  iVar6 = -1;
  learner_id = 0;
  lVar8 = 0;
  local_38 = ec;
  for (uVar9 = 0; uVar9 < puVar1[1]; uVar9 = uVar9 + 1) {
    uVar5 = (int)puVar1[1] + iVar6;
    lVar7 = 1L << ((byte)uVar5 & 0x3f);
    oracle = ((local_40 >> ((ulong)uVar5 & 0x3f) & 1) != 0) + 1;
    aVar2 = Search::search::predict
                      (sch,*(local_38->super__Vector_base<example_*,_std::allocator<example_*>_>).
                            _M_impl.super__Vector_impl_data._M_start,0,&oracle,1,(ptag *)0x0,
                       (char *)0x0,(action *)puVar1[2],2 - (ulong)(*puVar1 < lVar7 + lVar8 + 1U),
                       (float *)0x0,learner_id,0.0);
    learner_id = (ulong)aVar2 + learner_id * 2;
    if (aVar2 == 2) {
      lVar8 = lVar7 + lVar8;
    }
    iVar6 = iVar6 + -1;
  }
  if (lVar8 + 1U == local_48) {
    loss = 0.0;
  }
  else {
    loss = 1.0;
  }
  Search::search::loss(sch,loss);
  psVar3 = Search::search::output_abi_cxx11_(sch);
  if (*(int *)(psVar3 + *(long *)(*(long *)psVar3 + -0x18) + 0x20) == 0) {
    psVar3 = Search::search::output_abi_cxx11_(sch);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar3 + 0x10));
    std::operator<<(poVar4,' ');
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  size_t gold_label = ec[0]->l.multi.label;
  size_t label = 0;
  size_t learner_id = 0;

  for (size_t i = 0; i < my_task_data->num_level; i++)
  {
    size_t mask = UINT64_ONE << (my_task_data->num_level - i - 1);
    size_t y_allowed_size = (label + mask + 1 <= my_task_data->max_label) ? 2 : 1;
    action oracle = (((gold_label - 1) & mask) > 0) + 1;
    size_t prediction = sch.predict(*ec[0], 0, &oracle, 1, nullptr, nullptr, my_task_data->y_allowed.begin(),
        y_allowed_size, nullptr, learner_id);  // TODO: do we really need y_allowed?
    learner_id = (learner_id << 1) + prediction;
    if (prediction == 2)
      label += mask;
  }
  label += 1;
  sch.loss(!(label == gold_label));
  if (sch.output().good())
    sch.output() << label << ' ';
}